

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

void __thiscall
Refal2::CGlobalFunctionData::SetPreparatoryFunction
          (CGlobalFunctionData *this,CPreparatoryFunction *_preparatoryFunction,
          TRuntimeModuleId _runtimeModuleId)

{
  if (this->preparatoryFunction != (CPreparatoryFunction *)0x0 ||
      this->embeddedFunction != (TEmbeddedFunctionPtr)0x0) {
    __assert_fail("!IsDefined()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x66,
                  "void Refal2::CGlobalFunctionData::SetPreparatoryFunction(const CPreparatoryFunction *const, const TRuntimeModuleId)"
                 );
  }
  if (_preparatoryFunction != (CPreparatoryFunction *)0x0) {
    this->preparatoryFunction = _preparatoryFunction;
    this->runtimeModuleId = _runtimeModuleId;
    return;
  }
  __assert_fail("_preparatoryFunction != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                ,0x67,
                "void Refal2::CGlobalFunctionData::SetPreparatoryFunction(const CPreparatoryFunction *const, const TRuntimeModuleId)"
               );
}

Assistant:

void CGlobalFunctionData::SetPreparatoryFunction(
	const CPreparatoryFunction* const _preparatoryFunction,
	const TRuntimeModuleId _runtimeModuleId )
{
	assert( !IsDefined() );
	assert( _preparatoryFunction != nullptr );
	preparatoryFunction = _preparatoryFunction;
	runtimeModuleId = _runtimeModuleId;
}